

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O2

void Bac_ManWriteBlifArray(FILE *pFile,Bac_Ntk_t *p,Vec_Int_t *vFanins,int iObj)

{
  int i;
  char *pcVar1;
  int i_00;
  
  for (i_00 = 0; i_00 < vFanins->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(vFanins,i_00);
    pcVar1 = Bac_ObjNameStr(p,i);
    fprintf((FILE *)pFile," %s",pcVar1);
  }
  if (-1 < iObj) {
    pcVar1 = Bac_ObjNameStr(p,iObj);
    fprintf((FILE *)pFile," %s",pcVar1);
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Bac_ManWriteBlifArray( FILE * pFile, Bac_Ntk_t * p, Vec_Int_t * vFanins, int iObj )
{
    int iFanin, i;
    Vec_IntForEachEntry( vFanins, iFanin, i )
        fprintf( pFile, " %s", Bac_ObjNameStr(p, iFanin) );
    if ( iObj >= 0 )
        fprintf( pFile, " %s", Bac_ObjNameStr(p, iObj) );
    fprintf( pFile, "\n" );
}